

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestResult.cpp
# Opt level: O1

bool __thiscall
CppUnit::TestResult::protect(TestResult *this,Functor *functor,Test *test,string *shortDescription)

{
  pointer pcVar1;
  int iVar2;
  ProtectorContext context;
  Test *local_48;
  TestResult *local_40;
  long *local_38 [2];
  long local_28 [2];
  
  pcVar1 = (shortDescription->_M_dataplus)._M_p;
  local_48 = test;
  local_40 = this;
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_38,pcVar1,pcVar1 + shortDescription->_M_string_length);
  iVar2 = (*(this->m_protectorChain->super_Protector)._vptr_Protector[2])
                    (this->m_protectorChain,functor,&local_48);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return SUB41(iVar2,0);
}

Assistant:

bool 
TestResult::protect( const Functor &functor,
                     Test *test,
                     const std::string &shortDescription )
{
  ProtectorContext context( test, this, shortDescription );
  return m_protectorChain->protect( functor, context );
}